

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O1

CURLcode tftp_multi_statemach(Curl_easy *data,_Bool *done)

{
  ulong uVar1;
  tftp_state_data *state_00;
  curl_trc_feat *pcVar2;
  Curl_easy *data_00;
  int iVar3;
  CURLcode CVar4;
  timediff_t tVar5;
  time_t tVar6;
  int *piVar7;
  char *pcVar8;
  ssize_t sVar9;
  void *pvVar10;
  tftp_event_t tVar11;
  size_t sVar12;
  undefined8 uVar13;
  ulong __n;
  ushort *puVar14;
  char *fmt;
  size_t sVar15;
  tftp_state_data *state_01;
  tftp_state_data *state;
  ulong uVar16;
  ushort *puVar17;
  bool bVar18;
  curl_off_t blksize;
  char buffer [256];
  char *local_180;
  ushort *local_178;
  ushort *local_170;
  Curl_easy *local_168;
  tftp_state_data *local_160;
  _Bool *local_158;
  ushort *local_150;
  Curl_easy *local_148;
  socklen_t local_13c;
  char *local_138 [33];
  
  state_00 = (data->conn->proto).tftpc;
  tVar5 = Curl_timeleft(state_00->data,(curltime *)0x0,state_00->state == TFTP_STATE_START);
  if (tVar5 < 0) {
    state_00->error = TFTP_ERR_TIMEOUT;
    state_00->state = TFTP_STATE_FIN;
LAB_0015f301:
    tVar11 = TFTP_EVENT_NONE;
    bVar18 = true;
  }
  else {
    tVar6 = time((time_t *)0x0);
    if (tVar6 <= (long)state_00->retry_time + state_00->rx_time) goto LAB_0015f301;
    bVar18 = false;
    tVar6 = time((time_t *)0x0);
    state_00->rx_time = tVar6;
    tVar11 = TFTP_EVENT_TIMEOUT;
  }
  *done = false;
  if (!bVar18) goto LAB_0015f850;
  iVar3 = Curl_socket_check(state_00->sockfd,-1,-1,0);
  if (iVar3 == 0) {
    return CURLE_OK;
  }
  if (iVar3 == -1) {
    piVar7 = __errno_location();
    pcVar8 = Curl_strerror(*piVar7,(char *)local_138,0x100);
    Curl_failf(data,"%s",pcVar8);
    state_00->event = TFTP_EVENT_ERROR;
    return CURLE_OK;
  }
  state_01 = (data->conn->proto).tftpc;
  local_13c = 0x80;
  CVar4 = CURLE_OK;
  sVar9 = recvfrom(state_01->sockfd,(state_01->rpacket).data,(ulong)state_01->blksize + 4,0,
                   (sockaddr *)&state_01->remote_addr,&local_13c);
  iVar3 = (int)sVar9;
  state_01->rbytes = iVar3;
  state_01->remote_addrlen = local_13c;
  if (iVar3 < 4) {
    Curl_failf(data,"Received too short packet");
    state_01->event = TFTP_EVENT_TIMEOUT;
  }
  else {
    puVar14 = (ushort *)(state_01->rpacket).data;
    tVar11 = (tftp_event_t)(ushort)(*puVar14 << 8 | *puVar14 >> 8);
    state_01->event = tVar11;
    switch(tVar11) {
    case TFTP_EVENT_DATA:
      if (((iVar3 != 4) &&
          ((ushort)((short)*(undefined4 *)&state_01->block + 1U) ==
           (ushort)(puVar14[1] << 8 | puVar14[1] >> 8))) &&
         (CVar4 = Curl_client_write(data,1,(char *)(puVar14 + 2),(long)(iVar3 + -4)),
         CVar4 != CURLE_OK)) {
        tftp_state_machine(state_01,TFTP_EVENT_ERROR);
        goto LAB_0015f848;
      }
      break;
    case TFTP_EVENT_ACK:
      break;
    case TFTP_EVENT_ERROR:
      puVar17 = puVar14 + 2;
      state_01->error = (uint)(ushort)(puVar14[1] << 8 | puVar14[1] >> 8);
      pvVar10 = memchr(puVar17,0,(long)(iVar3 + -4));
      if (((data != (Curl_easy *)0x0) && (pvVar10 != (void *)0x0)) &&
         ((((ulong)((long)pvVar10 - (long)puVar17) < (ulong)(long)(iVar3 + -4) &&
           (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ))) {
        Curl_infof(data,"TFTP error: %s",puVar17);
      }
      break;
    case TFTP_EVENT_OACK:
      local_168 = state_01->data;
      state_01->blksize = 0x200;
      local_178 = (ushort *)((long)puVar14 + (long)(iVar3 + -2) + 2);
      puVar14 = puVar14 + 1;
      local_160 = state_01;
      local_158 = done;
      local_148 = data;
      do {
        __n = (long)local_178 - (long)puVar14;
        pvVar10 = memchr(puVar14,0,__n);
        uVar16 = (long)pvVar10 - (long)puVar14;
        if (pvVar10 == (void *)0x0) {
          uVar16 = __n;
        }
        uVar1 = uVar16 + 1;
        sVar15 = __n - uVar1;
        if (__n < uVar1 || sVar15 == 0) {
          puVar17 = (ushort *)0x0;
          puVar14 = local_150;
        }
        else {
          pvVar10 = memchr((void *)(uVar1 + (long)puVar14),0,sVar15);
          sVar12 = (long)pvVar10 - (long)(uVar1 + (long)puVar14);
          if (pvVar10 == (void *)0x0) {
            sVar12 = sVar15;
          }
          uVar16 = sVar12 + uVar16 + 2;
          if (__n < uVar16) {
            puVar17 = (ushort *)0x0;
          }
          else {
            sVar15 = strlen((char *)puVar14);
            local_138[0] = (char *)((long)puVar14 + sVar15 + 1);
            puVar17 = (ushort *)(uVar16 + (long)puVar14);
          }
        }
        data = local_148;
        done = local_158;
        state_01 = local_160;
        data_00 = local_168;
        if (puVar17 == (ushort *)0x0) {
          pcVar8 = "Malformed ACK packet, rejecting";
LAB_0015f7df:
          Curl_failf(data_00,pcVar8);
LAB_0015f81b:
          CVar4 = CURLE_TFTP_ILLEGAL;
          bVar18 = false;
          goto LAB_0015f822;
        }
        local_170 = puVar17;
        local_150 = puVar14;
        if (((local_168 != (Curl_easy *)0x0) && (((local_168->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar2 = (local_168->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
            (0 < pcVar2->log_level)))) {
          Curl_infof(local_168,"got option=(%s) value=(%s)",puVar14,local_138[0]);
        }
        puVar14 = local_150;
        iVar3 = curl_strnequal((char *)local_150,"blksize",7);
        if (iVar3 != 0) {
          iVar3 = Curl_str_number(local_138,(curl_off_t *)&local_180,0xffb8);
          if (iVar3 == 0) {
            if (local_180 == (char *)0x0) {
              pcVar8 = "invalid blocksize value in OACK packet";
              goto LAB_0015f7df;
            }
            if (7 < (long)local_180) {
              if ((long)(ulong)state_01->requested_blksize < (long)local_180) {
                fmt = "server requested blksize larger than allocated (%ld)";
                pcVar8 = local_180;
                goto LAB_0015f811;
              }
              state_01->blksize = (uint)local_180;
              if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x89f & 0x40) != 0)) &&
                 ((pcVar2 = (data_00->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar2->log_level)))) {
                Curl_infof(data_00,"blksize parsed from OACK (%d) requested (%d)");
              }
              goto LAB_0015f78b;
            }
            pcVar8 = "blksize is smaller than min supported";
            uVar13 = 8;
          }
          else {
            pcVar8 = "blksize is larger than max supported";
            uVar13 = 0xffb8;
          }
          Curl_failf(data_00,"%s (%d)",pcVar8,uVar13);
          goto LAB_0015f81b;
        }
        iVar3 = curl_strnequal((char *)puVar14,"tsize",5);
        if (((iVar3 != 0) && (local_180 = (char *)0x0, ((data_00->state).field_0x7c0 & 8) == 0)) &&
           (iVar3 = Curl_str_number(local_138,(curl_off_t *)&local_180,0x7fffffffffffffff),
           iVar3 == 0)) {
          if (local_180 == (char *)0x0) {
            fmt = "invalid tsize -:%s:- value in OACK packet";
            pcVar8 = local_138[0];
LAB_0015f811:
            Curl_failf(data_00,fmt,pcVar8);
            goto LAB_0015f81b;
          }
          if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x89f & 0x40) != 0)) &&
             ((pcVar2 = (data_00->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
              (0 < pcVar2->log_level)))) {
            Curl_infof(data_00,"tsize parsed from OACK (%ld)");
          }
          Curl_pgrsSetDownloadSize(data_00,(curl_off_t)local_180);
        }
LAB_0015f78b:
        puVar14 = local_170;
      } while (local_170 < local_178);
      CVar4 = CURLE_OK;
      bVar18 = true;
LAB_0015f822:
      if (!bVar18) goto LAB_0015f848;
      break;
    default:
      Curl_failf(data,"%s","Internal error: Unexpected packet");
    }
    iVar3 = Curl_pgrsUpdate(data);
    if (iVar3 == 0) {
      CVar4 = CURLE_OK;
    }
    else {
      tftp_state_machine(state_01,TFTP_EVENT_ERROR);
      CVar4 = CURLE_ABORTED_BY_CALLBACK;
    }
  }
LAB_0015f848:
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  tVar11 = state_00->event;
LAB_0015f850:
  CVar4 = tftp_state_machine(state_00,tVar11);
  if (CVar4 == CURLE_OK) {
    CVar4 = CURLE_OK;
    bVar18 = state_00->state == TFTP_STATE_FIN;
    *done = bVar18;
    if (bVar18) {
      Curl_xfer_setup_nop(data);
    }
  }
  return CVar4;
}

Assistant:

static CURLcode tftp_multi_statemach(struct Curl_easy *data, bool *done)
{
  tftp_event_t event;
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct tftp_state_data *state = conn->proto.tftpc;
  timediff_t timeout_ms = tftp_state_timeout(data, &event);

  *done = FALSE;

  if(timeout_ms < 0) {
    failf(data, "TFTP response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  if(event != TFTP_EVENT_NONE) {
    result = tftp_state_machine(state, event);
    if(result)
      return result;
    *done = (state->state == TFTP_STATE_FIN);
    if(*done)
      /* Tell curl we are done */
      Curl_xfer_setup_nop(data);
  }
  else {
    /* no timeouts to handle, check our socket */
    int rc = SOCKET_READABLE(state->sockfd, 0);

    if(rc == -1) {
      /* bail out */
      int error = SOCKERRNO;
      char buffer[STRERROR_LEN];
      failf(data, "%s", Curl_strerror(error, buffer, sizeof(buffer)));
      state->event = TFTP_EVENT_ERROR;
    }
    else if(rc) {
      result = tftp_receive_packet(data);
      if(result)
        return result;
      result = tftp_state_machine(state, state->event);
      if(result)
        return result;
      *done = (state->state == TFTP_STATE_FIN);
      if(*done)
        /* Tell curl we are done */
        Curl_xfer_setup_nop(data);
    }
    /* if rc == 0, then select() timed out */
  }

  return result;
}